

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O2

float xm_period(xm_context_t *ctx,float note)

{
  xm_frequency_type_t xVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  
  xVar1 = (ctx->module).frequency_type;
  if (xVar1 == XM_AMIGA_FREQUENCIES) {
    uVar5 = (ulong)(uint)((int)(((long)note & 0xffffffffU) % 0xc) << 2);
    iVar2 = *(int *)((long)amiga_frequencies + uVar5);
    iVar4 = *(int *)((long)amiga_frequencies + uVar5 + 4);
    bVar3 = (byte)(int)(note / 12.0 + -2.0);
    if ((char)bVar3 < '\x01') {
      if ((char)bVar3 < '\0') {
        iVar2 = iVar2 << (-bVar3 & 0x1f);
        iVar4 = iVar4 << (-bVar3 & 0x1f);
      }
    }
    else {
      iVar2 = iVar2 >> (bVar3 & 0x1f);
      iVar4 = iVar4 >> (bVar3 & 0x1f);
    }
    return ((float)(iVar4 - iVar2) * (note - (float)((long)note & 0xffffffff)) + (float)iVar2) *
           0.0009765625;
  }
  if (xVar1 == XM_LINEAR_FREQUENCIES) {
    return note * -64.0 + 7680.0;
  }
  return 0.0;
}

Assistant:

static float xm_period(xm_context_t* ctx, float note) {
	switch(ctx->module.frequency_type) {
	case XM_LINEAR_FREQUENCIES:
		return xm_linear_period(note);
	case XM_AMIGA_FREQUENCIES:
		return xm_amiga_period(note);
	}
	return .0f;
}